

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_math.cpp
# Opt level: O3

double getStandartDeviation(TRIPLERGB **mrx,int h,int w,int component,double E)

{
  byte bVar1;
  int i;
  int j;
  double dVar2;
  
  if (h < 1) {
    dVar2 = 0.0;
  }
  else {
    dVar2 = 0.0;
    i = 0;
    do {
      if (0 < w) {
        j = 0;
        do {
          bVar1 = getComponent((TRIPLEBYTES **)mrx,i,j,component);
          dVar2 = dVar2 + ((double)bVar1 - E) * ((double)bVar1 - E);
          j = j + 1;
        } while (w != j);
      }
      i = i + 1;
    } while (i != h);
  }
  return dVar2 / (double)(w * h);
}

Assistant:

double getStandartDeviation(TRIPLERGB **mrx, int h, int w, int component, double E) {
    double count = 0;
    for (int i = 0; i < h; i++) {
        for (int j = 0; j < w; j++) {
            count += pow((double) getComponent((TRIPLEBYTES **) mrx, i, j, component) - E, 2);
        }
    }
    return count / (w * h);
}